

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit_p.h
# Opt level: O2

void __thiscall QTextEditPrivate::sendControlEvent(QTextEditPrivate *this,QEvent *e)

{
  QWidgetTextControl *this_00;
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  QPointF local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidgetTextControl *)this->control;
  iVar1 = horizontalOffset(this);
  iVar2 = verticalOffset(this);
  local_30.yp = (qreal)iVar2;
  local_30.xp = (double)iVar1;
  QWidgetTextControl::processEvent
            (this_00,e,&local_30,(this->super_QAbstractScrollAreaPrivate).viewport);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void sendControlEvent(QEvent *e)
    { control->processEvent(e, QPointF(horizontalOffset(), verticalOffset()), viewport); }